

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

string * duckdb::Time::ConversionError_abi_cxx11_(string_t str)

{
  string *in_RDI;
  string local_40;
  string_t local_20;
  
  string_t::GetString_abi_cxx11_(&local_40,&local_20);
  ConversionError(in_RDI,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

string Time::ConversionError(string_t str) {
	return Time::ConversionError(str.GetString());
}